

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

bool __thiscall
QFontDatabasePrivate::isApplicationFont(QFontDatabasePrivate *this,QString *fileName)

{
  ulong uVar1;
  char16_t *pcVar2;
  long lVar3;
  char cVar4;
  qsizetype *pqVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  QStringView QVar9;
  QStringView QVar10;
  
  uVar1 = (this->applicationFonts).d.size;
  bVar7 = uVar1 != 0;
  if (bVar7) {
    pcVar2 = (fileName->d).ptr;
    lVar3 = (fileName->d).size;
    pqVar5 = &(((this->applicationFonts).d.ptr)->fileName).d.size;
    uVar6 = 1;
    do {
      if ((*pqVar5 == lVar3) &&
         (QVar9.m_data = (char16_t *)pqVar5[-1], QVar9.m_size = *pqVar5, QVar10.m_data = pcVar2,
         QVar10.m_size = lVar3, cVar4 = QtPrivate::equalStrings(QVar9,QVar10), cVar4 != '\0')) {
        return bVar7;
      }
      bVar7 = uVar6 < uVar1;
      pqVar5 = pqVar5 + 9;
      bVar8 = uVar6 != uVar1;
      uVar6 = uVar6 + 1;
    } while (bVar8);
  }
  return bVar7;
}

Assistant:

bool QFontDatabasePrivate::isApplicationFont(const QString &fileName)
{
    for (int i = 0; i < applicationFonts.size(); ++i)
        if (applicationFonts.at(i).fileName == fileName)
            return true;
    return false;
}